

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLDocument::Identify(XMLDocument *this,char *p,XMLNode **node)

{
  int iVar1;
  bool bVar2;
  XMLText *text;
  XMLNode *returnNode;
  int startLine;
  char *start;
  XMLNode **node_local;
  char *p_local;
  XMLDocument *this_local;
  
  iVar1 = this->_parseCurLineNum;
  this_local = (XMLDocument *)XMLUtil::SkipWhiteSpace(p,&this->_parseCurLineNum);
  if (*(char *)&(this_local->super_XMLNode)._vptr_XMLNode == '\0') {
    *node = (XMLNode *)0x0;
  }
  else {
    bVar2 = XMLUtil::StringEqual((char *)this_local,Identify::xmlHeader,2);
    if (bVar2) {
      text = (XMLText *)CreateUnlinkedNode<tinyxml2::XMLDeclaration,104>(this,&this->_commentPool);
      (text->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
      node_local = (XMLNode **)((long)&(this_local->super_XMLNode)._vptr_XMLNode + 2);
    }
    else {
      bVar2 = XMLUtil::StringEqual((char *)this_local,Identify::commentHeader,4);
      if (bVar2) {
        text = (XMLText *)CreateUnlinkedNode<tinyxml2::XMLComment,104>(this,&this->_commentPool);
        (text->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
        node_local = (XMLNode **)((long)&(this_local->super_XMLNode)._vptr_XMLNode + 4);
      }
      else {
        bVar2 = XMLUtil::StringEqual((char *)this_local,Identify::cdataHeader,9);
        if (bVar2) {
          text = CreateUnlinkedNode<tinyxml2::XMLText,112>(this,&this->_textPool);
          (text->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
          node_local = (XMLNode **)((long)&(this_local->super_XMLNode)._document + 1);
          XMLText::SetCData(text,true);
        }
        else {
          bVar2 = XMLUtil::StringEqual((char *)this_local,Identify::dtdHeader,2);
          if (bVar2) {
            text = (XMLText *)CreateUnlinkedNode<tinyxml2::XMLUnknown,104>(this,&this->_commentPool)
            ;
            (text->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
            node_local = (XMLNode **)((long)&(this_local->super_XMLNode)._vptr_XMLNode + 2);
          }
          else {
            bVar2 = XMLUtil::StringEqual((char *)this_local,Identify::elementHeader,1);
            if (bVar2) {
              text = (XMLText *)
                     CreateUnlinkedNode<tinyxml2::XMLElement,120>(this,&this->_elementPool);
              (((XMLElement *)text)->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
              node_local = (XMLNode **)((long)&(this_local->super_XMLNode)._vptr_XMLNode + 1);
            }
            else {
              text = CreateUnlinkedNode<tinyxml2::XMLText,112>(this,&this->_textPool);
              (text->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
              this->_parseCurLineNum = iVar1;
              node_local = (XMLNode **)p;
            }
          }
        }
      }
    }
    *node = &text->super_XMLNode;
    this_local = (XMLDocument *)node_local;
  }
  return (char *)this_local;
}

Assistant:

char* XMLDocument::Identify(char* p, XMLNode** node)
{
    TIXMLASSERT(node);
    TIXMLASSERT(p);
    char* const start = p;
    int const startLine = _parseCurLineNum;
    p = XMLUtil::SkipWhiteSpace(p, &_parseCurLineNum);
    if (!*p) {
        *node = 0;
        TIXMLASSERT(p);
        return p;
    }

    // These strings define the matching patterns:
    static const char* xmlHeader = {"<?"};
    static const char* commentHeader = {"<!--"};
    static const char* cdataHeader = {"<![CDATA["};
    static const char* dtdHeader = {"<!"};
    static const char* elementHeader = {"<"}; // and a header for everything else; check last.

    static const int xmlHeaderLen = 2;
    static const int commentHeaderLen = 4;
    static const int cdataHeaderLen = 9;
    static const int dtdHeaderLen = 2;
    static const int elementHeaderLen = 1;

    TIXMLASSERT(sizeof(XMLComment) == sizeof(XMLUnknown)); // use same memory pool
    TIXMLASSERT(sizeof(XMLComment) == sizeof(XMLDeclaration)); // use same memory pool
    XMLNode* returnNode = 0;
    if (XMLUtil::StringEqual(p, xmlHeader, xmlHeaderLen)) {
        returnNode = CreateUnlinkedNode<XMLDeclaration>(_commentPool);
        returnNode->_parseLineNum = _parseCurLineNum;
        p += xmlHeaderLen;
    } else if (XMLUtil::StringEqual(p, commentHeader, commentHeaderLen)) {
        returnNode = CreateUnlinkedNode<XMLComment>(_commentPool);
        returnNode->_parseLineNum = _parseCurLineNum;
        p += commentHeaderLen;
    } else if (XMLUtil::StringEqual(p, cdataHeader, cdataHeaderLen)) {
        XMLText* text = CreateUnlinkedNode<XMLText>(_textPool);
        returnNode = text;
        returnNode->_parseLineNum = _parseCurLineNum;
        p += cdataHeaderLen;
        text->SetCData(true);
    } else if (XMLUtil::StringEqual(p, dtdHeader, dtdHeaderLen)) {
        returnNode = CreateUnlinkedNode<XMLUnknown>(_commentPool);
        returnNode->_parseLineNum = _parseCurLineNum;
        p += dtdHeaderLen;
    } else if (XMLUtil::StringEqual(p, elementHeader, elementHeaderLen)) {
        returnNode = CreateUnlinkedNode<XMLElement>(_elementPool);
        returnNode->_parseLineNum = _parseCurLineNum;
        p += elementHeaderLen;
    } else {
        returnNode = CreateUnlinkedNode<XMLText>(_textPool);
        returnNode->_parseLineNum =
            _parseCurLineNum; // Report line of first non-whitespace character
        p = start; // Back it up, all the text counts.
        _parseCurLineNum = startLine;
    }

    TIXMLASSERT(returnNode);
    TIXMLASSERT(p);
    *node = returnNode;
    return p;
}